

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O0

void __thiscall Pl_Base64::decode(Pl_Base64 *this,uchar *data,size_t len)

{
  byte bVar1;
  size_t sVar2;
  char ch;
  bool bVar3;
  byte *local_28;
  uchar *p;
  size_t len_local;
  uchar *data_local;
  Pl_Base64 *this_local;
  
  local_28 = data;
  for (p = (uchar *)len; p != (uchar *)0x0; p = p + -1) {
    ch = to_c((uint)*local_28);
    bVar3 = ::qpdf::util::is_space(ch);
    if (!bVar3) {
      bVar1 = *local_28;
      sVar2 = this->pos;
      this->pos = sVar2 + 1;
      this->buf[sVar2] = bVar1;
      if (this->pos == 4) {
        flush(this);
      }
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void
Pl_Base64::decode(unsigned char const* data, size_t len)
{
    unsigned char const* p = data;
    while (len > 0) {
        if (!util::is_space(to_c(*p))) {
            this->buf[this->pos++] = *p;
            if (this->pos == 4) {
                flush();
            }
        }
        ++p;
        --len;
    }
}